

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O3

void __thiscall Saturation::SaturationAlgorithm::onPassiveAdded(SaturationAlgorithm *this,Clause *c)

{
  ostream *poVar1;
  string local_40;
  
  if ((*(char *)(Lib::env + 0x913a) != '\0') || ((*(byte *)(Lib::env + 0xa022) & 1) != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[SA] passive: ",0xe);
    Kernel::Clause::toString_abi_cxx11_(&local_40,c);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_40._M_dataplus._M_p,local_40._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->_symEl != (SymElOutput *)0x0) {
    SymElOutput::onNonRedundantClause(this->_symEl,c);
  }
  return;
}

Assistant:

void SaturationAlgorithm::onPassiveAdded(Clause* c)
{
  if (env.options->showPassive()) {
    std::cout << "[SA] passive: " << c->toString() << std::endl;
  }

  //when a clause is added to the passive container,
  //we know it is not redundant
  onNonRedundantClause(c);
}